

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

GCstr * lj_ctype_repr(lua_State *L,CTypeID id,GCstr *name)

{
  uint uVar1;
  MSize MVar2;
  bool bVar3;
  GCstr *pGVar4;
  uint uVar5;
  ulong uVar6;
  uint qual;
  CType *ct;
  char *pcVar7;
  long lVar8;
  long lVar9;
  uint32_t n;
  size_t sStack_280;
  char local_259;
  CTRepr ctr;
  
  ctr.pb = ctr.buf + 0x100;
  ctr.cts = *(CTState **)((L->glref).ptr64 + 0x180);
  ctr.needsp = 0;
  ctr.ok = 1;
  ctr.pe = ctr.pb;
  ctr.L = L;
  if (name != (GCstr *)0x0) {
    ctype_prepstr(&ctr,(char *)(name + 1),name->len);
  }
  ct = (ctr.cts)->tab + id;
  bVar3 = false;
  qual = 0;
  do {
    uVar1 = ct->info;
    if (8 < uVar1 >> 0x1c) goto switchD_00144a78_caseD_7;
    n = ct->size;
    switch(uVar1 >> 0x1c) {
    case 0:
      goto switchD_00144a78_caseD_0;
    case 1:
      pcVar7 = "union";
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar7 = "struct";
      }
      goto LAB_00144e4d;
    case 2:
      if ((uVar1 >> 0x17 & 1) == 0) {
        ctype_prepqual(&ctr,qual | uVar1);
        if (n == 4) {
          ctype_prepstr(&ctr,"__ptr32",7);
        }
        if (ctr.buf < ctr.pb) {
          ctr.pb[-1] = '*';
          ctr.pb = ctr.pb + -1;
        }
        else {
          ctr.needsp = 0;
          ctr.ok = 0;
        }
      }
      else if (ctr.buf < ctr.pb) {
        ctr.pb[-1] = '&';
        ctr.pb = ctr.pb + -1;
      }
      else {
        ctr.needsp = 0;
        ctr.ok = 0;
      }
      ctr.needsp = 1;
      qual = 0;
      bVar3 = true;
      break;
    case 3:
      if ((uVar1 & 0xfc000000) == 0x30000000) {
        ctr.needsp = 1;
        if (bVar3) {
          if (ctr.buf < ctr.pb) {
            ctr.pb[-1] = '(';
            ctr.pb = ctr.pb + -1;
          }
          else {
            ctr.needsp = 1;
            ctr.ok = 0;
          }
          if (ctr.pe < &stack0xffffffffffffffd0) {
            *ctr.pe = ')';
            ctr.pe = ctr.pe + 1;
          }
          else {
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
        }
        if (ctr.pe < &stack0xffffffffffffffd0) {
          *ctr.pe = '[';
          ctr.pe = ctr.pe + 1;
        }
        else {
          ctr._32_8_ = ctr._32_8_ & 0xffffffff;
        }
        pcVar7 = ctr.pe;
        if (n == 0xffffffff) {
          if ((uVar1 >> 0x14 & 1) != 0) {
            if (&stack0xffffffffffffffd0 <= ctr.pe) goto LAB_00144d12;
            *ctr.pe = '?';
            ctr.pe = ctr.pe + 1;
          }
        }
        else {
          uVar5 = (ctr.cts)->tab[(ushort)ct->info].size;
          if (uVar5 == 0) {
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)n / (ulong)uVar5;
          }
          if (ctr.buf + 0x1f6 < ctr.pe) {
LAB_00144d12:
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
          else {
            lVar9 = 0;
            do {
              lVar8 = lVar9;
              uVar5 = (uint)uVar6;
              ctr.buf[lVar8 + -0x29] = (byte)(uVar6 % 10) | 0x30;
              lVar9 = lVar8 + -1;
              uVar6 = uVar6 / 10;
            } while (9 < uVar5);
            memcpy(ctr.pe,ctr.buf + lVar8 + -0x29,-lVar9);
            ctr.pe = pcVar7 + -lVar9;
          }
        }
        if (&stack0xffffffffffffffd0 <= ctr.pe) goto LAB_00144d72;
        *ctr.pe = ']';
        ctr.pe = ctr.pe + 1;
        goto LAB_00144d77;
      }
      if ((uVar1 >> 0x1a & 1) != 0) {
        if (n == 8) {
          ctype_prepstr(&ctr,"float",5);
        }
        pcVar7 = "complex";
        MVar2 = 7;
        goto LAB_00144e83;
      }
      ctype_prepstr(&ctr,")))",3);
      ctype_prepnum(&ctr,n);
      ctype_prepstr(&ctr,"__attribute__((vector_size(",0x1b);
      break;
    case 4:
      ctype_prepstr(&ctr,"void",4);
      ctype_prepqual(&ctr,uVar1 | qual);
      goto LAB_00144fb4;
    case 5:
      if (id == 0x16) {
        pcVar7 = "ctype";
        MVar2 = 5;
LAB_00144e83:
        ctype_prepstr(&ctr,pcVar7,MVar2);
      }
      else {
        pcVar7 = "enum";
LAB_00144e4d:
        ctype_preptype(&ctr,ct,qual,pcVar7);
      }
      goto LAB_00144fb4;
    case 6:
      ctr.needsp = 1;
      if (bVar3) {
        if (ctr.buf < ctr.pb) {
          ctr.pb[-1] = '(';
          ctr.pb = ctr.pb + -1;
        }
        else {
          ctr.needsp = 1;
          ctr.ok = 0;
        }
        if (ctr.pe < &stack0xffffffffffffffd0) {
          *ctr.pe = ')';
          ctr.pe = ctr.pe + 1;
        }
        else {
          ctr._32_8_ = ctr._32_8_ & 0xffffffff;
        }
      }
      if (ctr.pe < &stack0xffffffffffffffd0) {
        *ctr.pe = '(';
        ctr.pe = ctr.pe + 1;
      }
      else {
        ctr._32_8_ = ctr._32_8_ & 0xffffffff;
      }
      if (ctr.pe < &stack0xffffffffffffffd0) {
        *ctr.pe = ')';
        ctr.pe = ctr.pe + 1;
      }
      else {
LAB_00144d72:
        ctr._32_8_ = ctr._32_8_ & 0xffffffff;
      }
LAB_00144d77:
      bVar3 = false;
      break;
    case 8:
      if ((uVar1 & 0xff0000) != 0x10000) {
        n = 0;
      }
      qual = qual | n;
    }
switchD_00144a78_caseD_7:
    ct = (ctr.cts)->tab + (uVar1 & 0xffff);
  } while( true );
switchD_00144a78_caseD_0:
  if ((uVar1 >> 0x1b & 1) != 0) {
    ctype_prepstr(&ctr,"bool",4);
    goto LAB_00144fa4;
  }
  if ((uVar1 >> 0x1a & 1) == 0) {
    if (n == 1) {
      if ((uVar1 >> 0x17 & 1) == 0) {
        pcVar7 = "char";
        MVar2 = 4;
      }
      else {
        pcVar7 = "unsigned char";
        MVar2 = 0xd;
      }
    }
    else {
      if (7 < n) {
        ctype_prepstr(&ctr,"_t",2);
        ctype_prepnum(&ctr,n << 3);
        ctype_prepstr(&ctr,"int",3);
        if ((uVar1 >> 0x17 & 1) != 0) {
          if (ctr.buf < ctr.pb) {
            ctr.pb[-1] = 'u';
            ctr.pb = ctr.pb + -1;
          }
          else {
            ctr._32_8_ = ctr._32_8_ & 0xffffffff;
          }
        }
        goto LAB_00144fa4;
      }
      if (n == 4) {
        pcVar7 = "int";
        MVar2 = 3;
      }
      else {
        pcVar7 = "short";
        MVar2 = 5;
      }
      ctype_prepstr(&ctr,pcVar7,MVar2);
      if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00144fa4;
      pcVar7 = "unsigned";
      MVar2 = 8;
    }
  }
  else if (n == 4) {
    pcVar7 = "float";
    MVar2 = 5;
  }
  else if (n == 8) {
    pcVar7 = "double";
    MVar2 = 6;
  }
  else {
    pcVar7 = "long double";
    MVar2 = 0xb;
  }
  ctype_prepstr(&ctr,pcVar7,MVar2);
LAB_00144fa4:
  ctype_prepqual(&ctr,uVar1 | qual);
LAB_00144fb4:
  if (ctr.ok == 0) {
    pcVar7 = "?";
    sStack_280 = 1;
  }
  else {
    sStack_280 = (long)ctr.pe - (long)ctr.pb;
    pcVar7 = ctr.pb;
  }
  pGVar4 = lj_str_new(L,pcVar7,sStack_280);
  return pGVar4;
}

Assistant:

GCstr *lj_ctype_repr(lua_State *L, CTypeID id, GCstr *name)
{
  global_State *g = G(L);
  CTRepr ctr;
  ctr.pb = ctr.pe = &ctr.buf[CTREPR_MAX/2];
  ctr.cts = ctype_ctsG(g);
  ctr.L = L;
  ctr.ok = 1;
  ctr.needsp = 0;
  if (name) ctype_prepstr(&ctr, strdata(name), name->len);
  ctype_repr(&ctr, id);
  if (LJ_UNLIKELY(!ctr.ok)) return lj_str_newlit(L, "?");
  return lj_str_new(L, ctr.pb, ctr.pe - ctr.pb);
}